

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O1

void __thiscall Diligent::VAOCache::OnDestroyBuffer(VAOCache *this,BufferGLImpl *Buffer)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  VAOHashKey *pVVar3;
  pointer pVVar4;
  byte bVar5;
  Int32 IVar6;
  ulong uVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  _Node_iterator_base<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_false>
  __it;
  VAOHashKey *Key;
  VAOHashKey *__args;
  vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> StaleKeys;
  vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_> local_48;
  
  local_48.
  super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
  ._M_impl.super__Vector_impl_data._M_finish = (VAOHashKey *)0x0;
  local_48.
  super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (VAOHashKey *)0x0;
  LOCK();
  bVar5 = (this->m_CacheLock).m_IsLocked._M_base._M_i;
  (this->m_CacheLock).m_IsLocked._M_base._M_i = true;
  UNLOCK();
  while ((bVar5 & 1) != 0) {
    Threading::SpinLock::Wait(&this->m_CacheLock);
    LOCK();
    bVar5 = (this->m_CacheLock).m_IsLocked._M_base._M_i;
    (this->m_CacheLock).m_IsLocked._M_base._M_i = true;
    UNLOCK();
  }
  IVar6 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                         *)Buffer);
  uVar1 = (this->m_BuffToKey)._M_h._M_bucket_count;
  uVar7 = (ulong)(long)IVar6 % uVar1;
  p_Var8 = (this->m_BuffToKey)._M_h._M_buckets[uVar7];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var8->_M_nxt, p_Var9 = p_Var8, IVar6 != *(int *)&p_Var8->_M_nxt[1]._M_nxt)) {
    while (p_Var8 = p_Var2, p_Var2 = p_Var8->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar7) ||
         (p_Var9 = p_Var8, IVar6 == *(int *)&p_Var2[1]._M_nxt)) goto LAB_0032014f;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_0032014f:
  if (p_Var9 == (__node_base_ptr)0x0) {
    __it._M_cur = (__node_type *)0x0;
  }
  else {
    __it._M_cur = (__node_type *)p_Var9->_M_nxt;
  }
  if (__it._M_cur != (__node_type *)0x0) {
    __args = *(VAOHashKey **)((long)__it._M_cur + 0x10);
    pVVar3 = *(VAOHashKey **)((long)__it._M_cur + 0x18);
    if (__args != pVVar3) {
      do {
        pVVar4 = local_48.
                 super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_48.
            super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_48.
            super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Diligent::VAOCache::VAOHashKey,std::allocator<Diligent::VAOCache::VAOHashKey>>
          ::_M_realloc_insert<Diligent::VAOCache::VAOHashKey_const&>
                    ((vector<Diligent::VAOCache::VAOHashKey,std::allocator<Diligent::VAOCache::VAOHashKey>>
                      *)&local_48,
                     (iterator)
                     local_48.
                     super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                     ._M_impl.super__Vector_impl_data._M_finish,__args);
        }
        else {
          memcpy(local_48.
                 super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                 ._M_impl.super__Vector_impl_data._M_finish,__args,0x218);
          local_48.
          super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
          ._M_impl.super__Vector_impl_data._M_finish = pVVar4 + 1;
        }
        std::
        _Hashtable<Diligent::VAOCache::VAOHashKey,_std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>,_std::allocator<std::pair<const_Diligent::VAOCache::VAOHashKey,_GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLVAOCreateReleaseHelper>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::VAOCache::VAOHashKey>,_Diligent::VAOCache::VAOHashKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::_M_erase(&(this->m_Cache)._M_h,__args);
        __args = __args + 1;
      } while (__args != pVVar3);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>,_std::allocator<std::pair<const_int,_std::vector<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->m_BuffToKey)._M_h,(const_iterator)__it._M_cur);
  }
  ClearStaleKeys(this,&local_48);
  Threading::SpinLock::unlock(&this->m_CacheLock);
  if (local_48.
      super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<Diligent::VAOCache::VAOHashKey,_std::allocator<Diligent::VAOCache::VAOHashKey>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void VAOCache::OnDestroyBuffer(const BufferGLImpl& Buffer)
{
    // Collect all stale keys that use this buffer.
    std::vector<VAOHashKey> StaleKeys;

    Threading::SpinLockGuard CacheGuard{m_CacheLock};

    const auto it = m_BuffToKey.find(Buffer.GetUniqueID());
    if (it != m_BuffToKey.end())
    {
        for (const auto& Key : it->second)
        {
            StaleKeys.push_back(Key);
            m_Cache.erase(Key);
        }
        m_BuffToKey.erase(it);
    }

    // Clear stale entries in m_PSOToKey and m_BuffToKey that refer to dead VAOs
    // to avoid memory leaks.
    ClearStaleKeys(StaleKeys);
}